

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

parse_buffer * buffer_skip_whitespace(parse_buffer *buffer)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (buffer != (parse_buffer *)0x0) {
    if (buffer->content != (uchar *)0x0) {
      uVar1 = buffer->length;
      uVar2 = buffer->offset;
      if (uVar1 <= uVar2) {
        return buffer;
      }
      do {
        uVar3 = uVar2 + 1;
        if (0x20 < buffer->content[uVar2]) {
          if (uVar3 - uVar1 != 1) {
            return buffer;
          }
          break;
        }
        buffer->offset = uVar3;
        uVar2 = uVar3;
      } while (uVar3 != uVar1);
      buffer->offset = uVar1 - 1;
      return buffer;
    }
  }
  return (parse_buffer *)0x0;
}

Assistant:

static parse_buffer *buffer_skip_whitespace(parse_buffer * const buffer)
{
    if ((buffer == NULL) || (buffer->content == NULL))
    {
        return NULL;
    }

    if (cannot_access_at_index(buffer, 0))
    {
        return buffer;
    }

    while (can_access_at_index(buffer, 0) && (buffer_at_offset(buffer)[0] <= 32))
    {
       buffer->offset++;
    }

    if (buffer->offset == buffer->length)
    {
        buffer->offset--;
    }

    return buffer;
}